

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map_checked.hh
# Opt level: O0

uint64_t __thiscall doublechecked::Roaring64Map::maximum(Roaring64Map *this)

{
  bool bVar1;
  reverse_iterator<std::_Rb_tree_const_iterator<unsigned_long>_> *prVar2;
  reference puVar3;
  unsigned_long in_RDI;
  uint64_t ans;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  reverse_iterator<std::_Rb_tree_const_iterator<unsigned_long>_> *in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd8;
  Roaring64Map *in_stack_ffffffffffffffe8;
  
  prVar2 = (reverse_iterator<std::_Rb_tree_const_iterator<unsigned_long>_> *)
           roaring::Roaring64Map::maximum(in_stack_ffffffffffffffe8);
  bVar1 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::empty
                    ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *
                     )0x11386b);
  if (bVar1) {
    bVar1 = prVar2 == (reverse_iterator<std::_Rb_tree_const_iterator<unsigned_long>_> *)0x0;
  }
  else {
    in_stack_ffffffffffffffd0 = prVar2;
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::rbegin
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    puVar3 = std::reverse_iterator<std::_Rb_tree_const_iterator<unsigned_long>_>::operator*
                       (in_stack_ffffffffffffffd0);
    bVar1 = in_stack_ffffffffffffffd0 ==
            (reverse_iterator<std::_Rb_tree_const_iterator<unsigned_long>_> *)*puVar3;
  }
  _assert_true(in_RDI,(char *)CONCAT17(bVar1,in_stack_ffffffffffffffd8),
               (char *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  return (uint64_t)prVar2;
}

Assistant:

uint64_t maximum() const {
        uint64_t ans = plain.maximum();
        assert_true(check.empty() ? ans == 0 : ans == *check.rbegin());
        return ans;
    }